

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_str_pad(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxu32 sVar1;
  int iVar2;
  undefined4 uVar3;
  char *pcVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  int iStrpad;
  char *local_48;
  int iLen;
  uint local_3c;
  undefined4 local_38;
  uint local_34;
  
  if (nArg < 2) {
    pcVar4 = "";
    iLen = 0;
LAB_0012cfb8:
    jx9_result_string(pCtx,pcVar4,iLen);
    return 0;
  }
  pcVar4 = jx9_value_to_string(*apArg,&iLen);
  iVar2 = jx9_value_to_int(apArg[1]);
  iVar6 = 0;
  if (0 < iVar2) {
    iVar6 = iLen;
  }
  local_3c = iVar2 - iVar6;
  if (local_3c == 0 || iVar2 < iVar6) goto LAB_0012cfb8;
  iStrpad = 1;
  uVar8 = 1;
  local_48 = pcVar4;
  if (nArg == 2) {
    pcVar4 = " ";
    uVar3 = 0;
  }
  else {
    pcVar4 = jx9_value_to_string(apArg[2],&iStrpad);
    if (iStrpad < 1) {
      iStrpad = 1;
      pcVar4 = " ";
    }
    if (((uint)nArg < 4) ||
       (uVar8 = jx9_value_to_int(apArg[3]), iVar6 = iStrpad, (uVar8 & 0xfffffffd) != 0)) {
      uVar8 = 1;
      uVar3 = 0;
    }
    else {
      uVar3 = CONCAT31((int3)(uVar8 >> 8),uVar8 == 2);
      if ((uVar8 & 0xfffffffd) == 0) {
        uVar9 = local_3c >> (uVar8 == 2);
        iVar7 = 0;
        local_38 = uVar3;
        local_34 = uVar8;
        while ((iVar7 < (int)uVar9 && ((int)((pCtx->pRet->sBlob).nByte + iVar6 + iLen) < iVar2))) {
          jx9_result_string(pCtx,pcVar4,iVar6);
          iVar7 = iVar7 + iVar6;
        }
        uVar8 = local_34;
        uVar3 = local_38;
        if (local_34 == 0) {
          while (iVar7 = (pCtx->pRet->sBlob).nByte + iLen, iVar6 = iVar2 - iVar7,
                iVar6 != 0 && iVar7 <= iVar2) {
            iVar7 = iStrpad;
            if (iVar6 < iStrpad) {
              iVar7 = iVar6;
            }
            if (iVar7 < 1) {
              uVar3 = 0;
              uVar8 = 0;
              goto LAB_0012d01f;
            }
            jx9_result_string(pCtx,pcVar4,iVar7);
          }
          bVar5 = 0;
          bVar10 = false;
          goto LAB_0012d030;
        }
      }
    }
  }
LAB_0012d01f:
  bVar5 = (byte)uVar3;
  bVar10 = uVar8 - 1 < 2;
LAB_0012d030:
  if (0 < iLen) {
    jx9_result_string(pCtx,local_48,iLen);
  }
  if (!bVar10) {
    return 0;
  }
  uVar8 = local_3c >> (bVar5 & 0x1f);
  iVar6 = 0;
  while ((iVar6 < (int)uVar8 && ((int)((pCtx->pRet->sBlob).nByte + iStrpad) < iVar2))) {
    jx9_result_string(pCtx,pcVar4,iStrpad);
    iVar6 = iVar6 + iStrpad;
  }
  while( true ) {
    sVar1 = (pCtx->pRet->sBlob).nByte;
    iVar6 = iVar2 - sVar1;
    if (iVar6 == 0 || iVar2 < (int)sVar1) {
      return 0;
    }
    iVar7 = iStrpad;
    if (iVar6 < iStrpad) {
      iVar7 = iVar6;
    }
    if (iVar7 < 1) break;
    jx9_result_string(pCtx,pcVar4,iVar7);
  }
  return 0;
}

Assistant:

static int jx9Builtin_str_pad(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int iLen, iPadlen, iType, i, iDiv, iStrpad, iRealPad, jPad;
	const char *zIn, *zPad;
	if( nArg < 2 ){
		/* Missing arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &iLen);
	/* Padding length */
	iRealPad = iPadlen = jx9_value_to_int(apArg[1]);
	if( iPadlen > 0 ){
		iPadlen -= iLen;
	}
	if( iPadlen < 1  ){
		/* Return the string verbatim */
		jx9_result_string(pCtx, zIn, iLen);
		return JX9_OK;
	}
	zPad = " "; /* Whitespace padding */
	iStrpad = (int)sizeof(char);
	iType = 1 ; /* STR_PAD_RIGHT */
	if( nArg > 2 ){
		/* Padding string */
		zPad = jx9_value_to_string(apArg[2], &iStrpad);
		if( iStrpad < 1 ){
			/* Empty string */
			zPad = " "; /* Whitespace padding */
			iStrpad = (int)sizeof(char);
		}
		if( nArg > 3 ){
			/* Padd type */
			iType = jx9_value_to_int(apArg[3]);
			if( iType != 0 /* STR_PAD_LEFT */ && iType != 2 /* STR_PAD_BOTH */ ){
				iType = 1 ; /* STR_PAD_RIGHT */
			}
		}
	}
	iDiv = 1;
	if( iType == 2 ){
		iDiv = 2; /* STR_PAD_BOTH */
	}
	/* Perform the requested operation */
	if( iType == 0 /* STR_PAD_LEFT */ || iType == 2 /* STR_PAD_BOTH */ ){
		jPad = iStrpad;
		for( i = 0 ; i < iPadlen/iDiv ; i += jPad ){
			/* Padding */
			if( (int)jx9_context_result_buf_length(pCtx) + iLen + jPad >= iRealPad ){
				break;
			}
			jx9_result_string(pCtx, zPad, jPad);
		}
		if( iType == 0 /* STR_PAD_LEFT */ ){
			while( (int)jx9_context_result_buf_length(pCtx) + iLen < iRealPad ){
				jPad = iRealPad - (iLen + (int)jx9_context_result_buf_length(pCtx) );
				if( jPad > iStrpad ){
					jPad = iStrpad;
				}
				if( jPad < 1){
					break;
				}
				jx9_result_string(pCtx, zPad, jPad);
			}
		}
	}
	if( iLen > 0 ){
		/* Append the input string */
		jx9_result_string(pCtx, zIn, iLen);
	}
	if( iType == 1 /* STR_PAD_RIGHT */ || iType == 2 /* STR_PAD_BOTH */ ){
		for( i = 0 ; i < iPadlen/iDiv ; i += iStrpad ){
			/* Padding */
			if( (int)jx9_context_result_buf_length(pCtx) + iStrpad >= iRealPad ){
				break;
			}
			jx9_result_string(pCtx, zPad, iStrpad);
		}
		while( (int)jx9_context_result_buf_length(pCtx) < iRealPad ){
			jPad = iRealPad - (int)jx9_context_result_buf_length(pCtx);
			if( jPad > iStrpad ){
				jPad = iStrpad;
			}
			if( jPad < 1){
				break;
			}
			jx9_result_string(pCtx, zPad, jPad);
		}
	}
	return JX9_OK;
}